

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O3

int ON_ComponentIndexAndNumber::CompareComponent
              (ON_ComponentIndexAndNumber *a,ON_ComponentIndexAndNumber *b)

{
  TYPE TVar1;
  TYPE TVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  if (a != b) {
    uVar5 = 0xffffffff;
    if (b != (ON_ComponentIndexAndNumber *)0x0 && a != (ON_ComponentIndexAndNumber *)0x0) {
      TVar1 = (b->m_ci).m_type;
      TVar2 = (a->m_ci).m_type;
      if (((int)TVar1 <= (int)TVar2) && (uVar5 = 1, (int)TVar2 <= (int)TVar1)) {
        iVar3 = (b->m_ci).m_index;
        uVar5 = 0xffffffff;
        iVar4 = (a->m_ci).m_index;
        if (iVar3 <= iVar4) {
          uVar5 = (uint)(iVar3 < iVar4);
        }
      }
    }
    return uVar5;
  }
  return 0;
}

Assistant:

int ON_ComponentIndexAndNumber::CompareComponent(
  const ON_ComponentIndexAndNumber* a,
  const ON_ComponentIndexAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1; // nulls sort last
  if (nullptr == b)
    return -1; // nulls sort last
  return ON_COMPONENT_INDEX::Compare(&a->m_ci, &b->m_ci);
}